

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void encode_field(upb_encstate *e,upb_Message *msg,upb_MiniTableSubInternal *subs,
                 upb_MiniTableField *field)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  upb_MiniTable *puVar4;
  upb_Map *map;
  ulong *puVar5;
  undefined8 *puVar6;
  long lVar7;
  char *pcVar8;
  _Bool _Var9;
  uint32_t uVar10;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  size_t __n;
  upb_MiniTable *puVar14;
  uint uVar15;
  upb_Array *arr;
  ulong uVar16;
  char *val_00;
  ulong uVar17;
  uint *******pppppppuVar18;
  long lVar19;
  intptr_t iter_1;
  upb_StringView strkey;
  upb_value val;
  intptr_t iter;
  upb_MapEntry ent;
  uint *******local_90;
  upb_StringView local_88;
  upb_value local_78;
  uintptr_t local_70;
  anon_union_8_2_9eb4e620_for_upb_Message_0 local_68 [2];
  anon_union_16_3_fdccde34_for_k local_58;
  anon_union_16_3_fdccde34_for_v local_48;
  long local_38;
  
  bVar2 = field->mode_dont_copy_me__upb_internal_use_only;
  switch(bVar2 & 3) {
  case 0:
    puVar4 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    if (puVar4->field_count_dont_copy_me__upb_internal_use_only != 2) {
      __assert_fail("upb_MiniTable_FieldCount(layout) == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/encode.c"
                    ,0x1bc,
                    "void encode_map(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                   );
    }
    map = *(upb_Map **)
           ((long)&msg->field_0 + (ulong)field->offset_dont_copy_me__upb_internal_use_only);
    if (map == (upb_Map *)0x0) {
      return;
    }
    sVar13 = upb_Map_Size(map);
    if (sVar13 == 0) {
      return;
    }
    if ((e->options & 1) == 0) {
      if (map->is_strtable_dont_copy_me__upb_internal_use_only != true) {
        local_90 = (uint *******)0xffffffffffffffff;
        local_70 = 0;
        _Var9 = upb_inttable_next(&(map->t).inttable,&local_70,&local_78,(intptr_t *)&local_90);
        if (!_Var9) {
          return;
        }
        do {
          memcpy(&local_58,&local_70,(long)map->key_size);
          local_88.data = (char *)local_78.val;
          if ((long)map->val_size == 0) {
            local_48.str.data = (char *)*(undefined8 *)local_78.val;
            local_48.str.size = (size_t)*(uint *******)(local_78.val + 8);
          }
          else {
            memcpy(&local_48,&local_88,(long)map->val_size);
          }
          encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar4,
                          (upb_MapEntry *)local_68);
          _Var9 = upb_inttable_next(&(map->t).inttable,&local_70,&local_78,(intptr_t *)&local_90);
        } while (_Var9);
        return;
      }
      local_70 = 0xffffffffffffffff;
      _Var9 = upb_strtable_next2(&(map->t).strtable,&local_88,&local_78,(intptr_t *)&local_70);
      if (!_Var9) {
        return;
      }
      do {
        if ((long)map->key_size == 0) {
          local_58.val.val = (upb_value)(upb_value)local_88.data;
        }
        else {
          memcpy(&local_58,local_88.data,(long)map->key_size);
        }
        local_90 = (uint *******)local_78.val;
        if ((long)map->val_size == 0) {
          local_48.str.data = (char *)*(undefined8 *)local_78.val;
          local_48.str.size = (size_t)*(uint *******)(local_78.val + 8);
        }
        else {
          memcpy(&local_48,&local_90,(long)map->val_size);
        }
        encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar4,
                        (upb_MapEntry *)local_68);
        _Var9 = upb_strtable_next2(&(map->t).strtable,&local_88,&local_78,(intptr_t *)&local_70);
      } while (_Var9);
      return;
    }
    if ((map->is_strtable_dont_copy_me__upb_internal_use_only == false) &&
       (uVar10 = (map->t).inttable.array_size, uVar10 != 0)) {
      pppppppuVar18 = (uint *******)0x0;
      do {
        if (((map->t).inttable.presence_mask[(ulong)pppppppuVar18 >> 3] >> ((uint)pppppppuVar18 & 7)
            & 1) != 0) {
          local_88.data = (char *)(map->t).inttable.array[(long)pppppppuVar18].val;
          local_58._0_8_ = pppppppuVar18;
          if ((long)map->val_size == 0) {
            local_48.str.data = (char *)*(undefined8 *)local_88.data;
            local_48.str.size = (size_t)*(uint *******)((long)local_88.data + 8);
          }
          else {
            memcpy(&local_48,&local_88,(long)map->val_size);
          }
          encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar4,
                          (upb_MapEntry *)local_68);
          uVar10 = (map->t).inttable.array_size;
        }
        pppppppuVar18 = (uint *******)((long)pppppppuVar18 + 1);
      } while (pppppppuVar18 < (uint *******)(ulong)uVar10);
    }
    _upb_mapsorter_pushmap
              (&e->sorter,
               (uint)puVar4->fields_dont_copy_me__upb_internal_use_only->
                     descriptortype_dont_copy_me__upb_internal_use_only,map,
               (_upb_sortedmap *)&local_88);
    iVar11 = local_88.data._4_4_;
    if (local_88.data._4_4_ != (int)local_88.size) {
      do {
        local_88.data = (char *)CONCAT44(iVar11 + 1,(int)local_88.data);
        puVar6 = (undefined8 *)(e->sorter).entries[iVar11];
        if (map->is_strtable_dont_copy_me__upb_internal_use_only == true) {
          pppppppuVar18 = (uint *******)((uint *)puVar6[1] + 1);
          __n = (size_t)map->key_size;
          if (__n != 0) goto LAB_0030866d;
          local_58.str.size = (size_t)*(uint *)puVar6[1];
          local_58.str.data = (char *)pppppppuVar18;
        }
        else {
          local_90 = (uint *******)puVar6[1];
          __n = (size_t)map->key_size;
          pppppppuVar18 = (uint *******)&local_90;
LAB_0030866d:
          memcpy(&local_58,pppppppuVar18,__n);
        }
        local_90 = (uint *******)*puVar6;
        if ((long)map->val_size == 0) {
          local_48.str.data = (char *)*local_90;
          local_48.str.size = (size_t)local_90[1];
        }
        else {
          memcpy(&local_48,&local_90,(long)map->val_size);
        }
        encode_mapentry(e,field->number_dont_copy_me__upb_internal_use_only,puVar4,
                        (upb_MapEntry *)local_68);
        iVar11 = local_88.data._4_4_;
      } while (local_88.data._4_4_ != (int)local_88.size);
    }
    (e->sorter).size = (int)local_88.data;
    return;
  case 1:
    puVar5 = *(ulong **)
              ((long)&msg->field_0 + (ulong)field->offset_dont_copy_me__upb_internal_use_only);
    if (puVar5 == (ulong *)0x0) {
      return;
    }
    sVar13 = puVar5[1];
    if (sVar13 == 0) {
      return;
    }
    break;
  case 2:
    encode_scalar(e,(void *)((long)&msg->field_0 +
                            (ulong)field->offset_dont_copy_me__upb_internal_use_only),subs,field);
    return;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/encode.c"
                  ,0x224,
                  "void encode_field(upb_encstate *, const upb_Message *, const upb_MiniTableSubInternal *, const upb_MiniTableField *)"
                 );
  }
  local_38 = (long)e->ptr - (long)e->limit;
  switch(field->descriptortype_dont_copy_me__upb_internal_use_only) {
  case '\x01':
  case '\x06':
  case '\x10':
    arr = (upb_Array *)*puVar5;
    uVar10 = 8;
    goto LAB_0030879f;
  case '\x02':
  case '\a':
  case '\x0f':
    arr = (upb_Array *)*puVar5;
    uVar10 = 4;
LAB_0030879f:
    encode_fixedarray(e,arr,sVar13,uVar10);
    break;
  case '\x03':
  case '\x04':
    uVar17 = *puVar5;
    uVar12 = 0;
    if ((bVar2 & 4) == 0) {
      uVar12 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar19 = sVar13 << 3;
    do {
      uVar16 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar19);
      if ((uVar16 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = (char)uVar16;
      }
      else {
        encode_longvarint(e,uVar16);
      }
      if ((ulong)uVar12 != 0) {
        if ((uVar12 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
          e->ptr = pcVar8 + -1;
          pcVar8[-1] = (char)uVar12;
        }
        else {
          encode_longvarint(e,(ulong)uVar12);
        }
      }
      lVar19 = lVar19 + -8;
    } while (lVar19 != 0);
    break;
  case '\x05':
  case '\x0e':
    uVar17 = *puVar5;
    uVar12 = 0;
    if ((bVar2 & 4) == 0) {
      uVar12 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar19 = sVar13 << 2;
    do {
      iVar11 = *(int *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar19);
      if (((ulong)(long)iVar11 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = (char)iVar11;
      }
      else {
        encode_longvarint(e,(long)iVar11);
      }
      if ((ulong)uVar12 != 0) {
        if ((uVar12 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
          e->ptr = pcVar8 + -1;
          pcVar8[-1] = (char)uVar12;
        }
        else {
          encode_longvarint(e,(ulong)uVar12);
        }
      }
      lVar19 = lVar19 + -4;
    } while (lVar19 != 0);
    break;
  case '\b':
    uVar17 = *puVar5;
    uVar12 = 0;
    if ((bVar2 & 4) == 0) {
      uVar12 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    do {
      bVar3 = *(byte *)(((uVar17 & 0xfffffffffffffff8) - 1) + sVar13);
      pcVar8 = e->ptr;
      if (pcVar8 == e->buf) {
        encode_longvarint(e,(ulong)bVar3);
      }
      else {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = bVar3;
      }
      if ((ulong)uVar12 != 0) {
        if ((uVar12 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
          e->ptr = pcVar8 + -1;
          pcVar8[-1] = (char)uVar12;
        }
        else {
          encode_longvarint(e,(ulong)uVar12);
        }
      }
      sVar13 = sVar13 - 1;
    } while (sVar13 != 0);
    break;
  case '\t':
  case '\f':
    uVar17 = *puVar5 & 0xfffffffffffffff8;
    lVar19 = sVar13 << 4;
    do {
      encode_bytes(e,*(void **)((uVar17 - 0x10) + lVar19),*(size_t *)((uVar17 - 8) + lVar19));
      uVar16 = *(ulong *)((uVar17 - 8) + lVar19);
      if ((uVar16 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = (char)uVar16;
      }
      else {
        encode_longvarint(e,uVar16);
      }
      uVar12 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar8 = e->ptr, pcVar8 != e->buf)) {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = (char)uVar12;
      }
      else {
        encode_longvarint(e,(ulong)uVar12);
      }
      lVar19 = lVar19 + -0x10;
    } while (lVar19 != 0);
    return;
  case '\n':
    uVar17 = *puVar5;
    puVar4 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
LAB_00308e5d:
      encode_err(e,kUpb_EncodeStatus_MaxDepthExceeded);
    }
    lVar19 = sVar13 << 3;
    do {
      uVar12 = field->number_dont_copy_me__upb_internal_use_only * 8 + 4;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar8 = e->ptr, pcVar8 != e->buf)) {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = (char)uVar12;
      }
      else {
        encode_longvarint(e,(ulong)uVar12);
      }
      uVar16 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar19);
      puVar14 = puVar4;
      if ((uVar16 & 1) != 0) {
        puVar14 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
      }
      encode_message(e,(upb_Message *)(uVar16 & 0xfffffffffffffffe),puVar14,
                     &local_68[0].internal_opaque);
      uVar12 = field->number_dont_copy_me__upb_internal_use_only * 8 + 3;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar8 = e->ptr, pcVar8 != e->buf)) {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = (char)uVar12;
      }
      else {
        encode_longvarint(e,(ulong)uVar12);
      }
      lVar19 = lVar19 + -8;
    } while (lVar19 != 0);
    goto LAB_00308cef;
  case '\v':
    uVar17 = *puVar5;
    puVar4 = *subs[field->submsg_index_dont_copy_me__upb_internal_use_only].
              submsg_dont_copy_me__upb_internal_use_only;
    piVar1 = &e->depth;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) goto LAB_00308e5d;
    lVar19 = sVar13 << 3;
    do {
      uVar16 = *(ulong *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar19);
      puVar14 = puVar4;
      if ((uVar16 & 1) != 0) {
        puVar14 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
      }
      encode_message(e,(upb_Message *)(uVar16 & 0xfffffffffffffffe),puVar14,
                     &local_68[0].internal_opaque);
      if (((ulong)local_68[0] < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = (char)local_68[0].internal_opaque;
      }
      else {
        encode_longvarint(e,local_68[0].internal_opaque);
      }
      uVar12 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
      if ((field->number_dont_copy_me__upb_internal_use_only << 3 < 0x80) &&
         (pcVar8 = e->ptr, pcVar8 != e->buf)) {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = (char)uVar12;
      }
      else {
        encode_longvarint(e,(ulong)uVar12);
      }
      lVar19 = lVar19 + -8;
    } while (lVar19 != 0);
LAB_00308cef:
    e->depth = e->depth + 1;
    return;
  case '\r':
    uVar17 = *puVar5;
    uVar12 = 0;
    if ((bVar2 & 4) == 0) {
      uVar12 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar19 = sVar13 << 2;
    do {
      uVar15 = *(uint *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar19);
      if (((ulong)uVar15 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = (char)uVar15;
      }
      else {
        encode_longvarint(e,(ulong)uVar15);
      }
      if ((ulong)uVar12 != 0) {
        if ((uVar12 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
          e->ptr = pcVar8 + -1;
          pcVar8[-1] = (char)uVar12;
        }
        else {
          encode_longvarint(e,(ulong)uVar12);
        }
      }
      lVar19 = lVar19 + -4;
    } while (lVar19 != 0);
    break;
  case '\x11':
    uVar17 = *puVar5;
    uVar12 = 0;
    if ((bVar2 & 4) == 0) {
      uVar12 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar19 = sVar13 << 2;
    do {
      iVar11 = *(int *)(((uVar17 & 0xfffffffffffffff8) - 4) + lVar19);
      uVar15 = iVar11 >> 0x1f ^ iVar11 * 2;
      if ((uVar15 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = (char)uVar15;
      }
      else {
        encode_longvarint(e,(ulong)uVar15);
      }
      if ((ulong)uVar12 != 0) {
        if ((uVar12 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
          e->ptr = pcVar8 + -1;
          pcVar8[-1] = (char)uVar12;
        }
        else {
          encode_longvarint(e,(ulong)uVar12);
        }
      }
      lVar19 = lVar19 + -4;
    } while (lVar19 != 0);
    break;
  case '\x12':
    uVar17 = *puVar5;
    uVar12 = 0;
    if ((bVar2 & 4) == 0) {
      uVar12 = field->number_dont_copy_me__upb_internal_use_only << 3;
    }
    lVar19 = sVar13 << 3;
    do {
      lVar7 = *(long *)(((uVar17 & 0xfffffffffffffff8) - 8) + lVar19);
      uVar16 = lVar7 >> 0x3f ^ lVar7 * 2;
      if ((uVar16 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
        e->ptr = pcVar8 + -1;
        pcVar8[-1] = (char)uVar16;
      }
      else {
        encode_longvarint(e,uVar16);
      }
      if ((ulong)uVar12 != 0) {
        if ((uVar12 < 0x80) && (pcVar8 = e->ptr, pcVar8 != e->buf)) {
          e->ptr = pcVar8 + -1;
          pcVar8[-1] = (char)uVar12;
        }
        else {
          encode_longvarint(e,(ulong)uVar12);
        }
      }
      lVar19 = lVar19 + -8;
    } while (lVar19 != 0);
  }
  if ((bVar2 & 4) != 0) {
    pcVar8 = e->ptr;
    val_00 = e->limit + (local_38 - (long)pcVar8);
    if ((val_00 < (char *)0x80) && (pcVar8 != e->buf)) {
      e->ptr = pcVar8 + -1;
      pcVar8[-1] = (char)val_00;
    }
    else {
      encode_longvarint(e,(uint64_t)val_00);
    }
    uVar12 = field->number_dont_copy_me__upb_internal_use_only * 8 + 2;
    if ((0x7f < field->number_dont_copy_me__upb_internal_use_only << 3) ||
       (pcVar8 = e->ptr, pcVar8 == e->buf)) {
      encode_longvarint(e,(ulong)uVar12);
      return;
    }
    e->ptr = pcVar8 + -1;
    pcVar8[-1] = (char)uVar12;
  }
  return;
}

Assistant:

static void encode_field(upb_encstate* e, const upb_Message* msg,
                         const upb_MiniTableSubInternal* subs,
                         const upb_MiniTableField* field) {
  switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(field)) {
    case kUpb_FieldMode_Array:
      encode_array(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Map:
      encode_map(e, msg, subs, field);
      break;
    case kUpb_FieldMode_Scalar:
      encode_scalar(e, UPB_PTR_AT(msg, field->UPB_PRIVATE(offset), void), subs,
                    field);
      break;
    default:
      UPB_UNREACHABLE();
  }
}